

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O1

int __thiscall argagg::option_result::as<int>(option_result *this,int *t)

{
  int iVar1;
  
  if (this->arg == (char *)0x0) {
    iVar1 = *t;
  }
  else {
    iVar1 = convert::long_<int>(this->arg);
  }
  return iVar1;
}

Assistant:

T option_result::as(const T& t) const
{
  if (this->arg) {
    try {
      return convert::arg<T>(this->arg);
    } catch (...) {
      return t;
    }
  } else {
    // I actually think this will never happen. To call this method you have
    // to access a specific option_result for an option. If there's a
    // specific option_result then the option was found. If the option
    // requires an argument then it will definitely have an argument
    // otherwise the parser would have complained.
    return t;
  }
}